

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall
bpwriter::format_int(bpwriter *this,char *p,size_t len,char *type_prefix,fmtopts *opts,int flags)

{
  char cVar1;
  wchar_t wVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int i;
  int iVar8;
  char *ptr;
  char cVar9;
  CVmObjString *this_00;
  int iVar10;
  size_t sVar11;
  int iVar12;
  size_t sVar13;
  bool bVar14;
  char local_64;
  char local_63;
  char local_62;
  char local_61;
  size_t local_60;
  char local_52 [2];
  char *local_50;
  int local_48;
  uint local_44;
  char *local_40;
  fmtopts *local_38;
  
  bVar14 = len == 0;
  if (bVar14 || p == (char *)0x0) {
    len = 1;
  }
  local_50 = "0";
  if (!bVar14 && p != (char *)0x0) {
    local_50 = p;
  }
  cVar1 = *local_50;
  sVar13 = 1;
  do {
    if (cVar1 != '0') break;
    bVar14 = len != sVar13;
    sVar13 = sVar13 + 1;
  } while (bVar14);
  cVar9 = opts->sign;
  iVar12 = (uint)(cVar9 != '\0' && cVar1 != '-') + (int)len;
  if (opts->group != L'\0') {
    iVar12 = iVar12 + (int)((~(ulong)(cVar1 == '-') + len) / 3);
  }
  iVar8 = (int)len - (uint)(cVar1 == '-');
  local_60 = len;
  local_44 = flags;
  local_40 = type_prefix;
  if (((cVar1 != '0') && (type_prefix != (char *)0x0)) && (opts->pound != 0)) {
    sVar6 = strlen(type_prefix);
    iVar12 = iVar12 + (int)sVar6;
  }
  iVar5 = opts->prec - iVar8;
  if (iVar5 == 0 || opts->prec < iVar8) {
    iVar5 = 0;
  }
  iVar10 = opts->width - (iVar5 + iVar12);
  local_48 = 0;
  if (iVar10 != 0 && iVar5 + iVar12 <= opts->width) {
    local_48 = iVar10;
  }
  cVar4 = cVar1;
  if ((opts->left_align == 0) && (local_48 != 0)) {
    wVar2 = opts->pad;
    pcVar7 = this->dst;
    iVar12 = iVar10;
    local_38 = opts;
    do {
      pcVar7 = CVmObjString::cons_append(this->str,pcVar7,wVar2,0x40);
      this->dst = pcVar7;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    cVar9 = local_38->sign;
    cVar4 = *local_50;
    opts = local_38;
  }
  if (cVar9 == '\0') {
LAB_0022aaac:
    if (cVar4 != '-') goto LAB_0022aae0;
  }
  else if (cVar4 != '-') {
    local_52[0] = cVar9;
    pcVar7 = CVmObjString::cons_append(this->str,this->dst,local_52,1,0x40);
    this->dst = pcVar7;
    cVar4 = *local_50;
    goto LAB_0022aaac;
  }
  local_50 = local_50 + 1;
  local_52[1] = 0x2d;
  pcVar7 = CVmObjString::cons_append(this->str,this->dst,local_52 + 1,1,0x40);
  this->dst = pcVar7;
  local_60 = local_60 - 1;
LAB_0022aae0:
  pcVar7 = local_40;
  if (((cVar1 != '0') && (local_40 != (char *)0x0)) && (opts->pound != 0)) {
    sVar6 = strlen(local_40);
    pcVar7 = CVmObjString::cons_append(this->str,this->dst,pcVar7,sVar6,0x40);
    this->dst = pcVar7;
  }
  if (iVar8 < opts->prec) {
    pcVar7 = this->dst;
    do {
      local_64 = '0';
      pcVar7 = CVmObjString::cons_append(this->str,pcVar7,&local_64,1,0x40);
      this->dst = pcVar7;
      iVar8 = iVar8 + 1;
    } while (iVar8 < opts->prec);
  }
  uVar3 = local_44;
  if (local_60 != 0) {
    sVar11 = 0;
    sVar13 = local_60;
    do {
      if (((local_60 + (sVar13 / 3) * -3 == sVar11) && (opts->group != L'\0')) && ((int)sVar11 != 0)
         ) {
        pcVar7 = CVmObjString::cons_append(this->str,this->dst,opts->group,0x40);
        this->dst = pcVar7;
      }
      iVar12 = (int)local_50[sVar11];
      if (iVar12 - 0x3aU < 0xfffffff6) {
        if ((uVar3 & 2) == 0) {
          iVar12 = tolower(iVar12);
          local_61 = (char)iVar12;
          this_00 = this->str;
          ptr = this->dst;
          pcVar7 = &local_61;
        }
        else {
          iVar12 = toupper(iVar12);
          local_62 = (char)iVar12;
          this_00 = this->str;
          ptr = this->dst;
          pcVar7 = &local_62;
        }
      }
      else {
        this_00 = this->str;
        ptr = this->dst;
        pcVar7 = &local_63;
        local_63 = local_50[sVar11];
      }
      pcVar7 = CVmObjString::cons_append(this_00,ptr,pcVar7,1,0x40);
      this->dst = pcVar7;
      sVar13 = sVar13 - 1;
      sVar11 = sVar11 + 1;
    } while (local_60 != sVar11);
  }
  if ((opts->left_align != 0) && (local_48 != 0)) {
    wVar2 = opts->pad;
    pcVar7 = this->dst;
    do {
      pcVar7 = CVmObjString::cons_append(this->str,pcVar7,wVar2,0x40);
      this->dst = pcVar7;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

void format_int(VMG_ const char *p, size_t len,
                    const char *type_prefix,
                    const fmtopts &opts, int flags)
    {
        /* if they're trying to pawn off an empty string on us, use "0" */
        if (p == 0 || len == 0)
            p = "0", len = 1;

        /* note if the value is all zeros */
        int zero = TRUE;
        const char *p2 = p;
        for (size_t i = 0 ; i < len ; ++i)
        {
            if (*p2 != '0')
            {
                zero = FALSE;
                break;
            }
        }

        /* 
         *   get the number of digits: assume that the whole thing is digits
         *   except for a leading minus sign 
         */
        int digits = len;
        if (*p == '-')
            --digits;

        /* 
         *   Figure the display width required.  Start with the length of the
         *   string.  If we the "sign" option is set and we don't have a "-"
         *   sign, add space for a "+" sign.  If the "group" option is set,
         *   add a comma for each group of three digits.  If the '#' flag is
         *   set, add the type prefix if the value is nonzero.  
         */
        int dispwid = len;
        if (opts.sign != '\0' && *p != '-')
            dispwid += 1;
        if (opts.group != 0)
            dispwid += ((len - (*p == '-' ? 1 : 0)) - 1)/3;
        if (opts.pound && type_prefix != 0 && !zero)
            dispwid += strlen(type_prefix);

        /*
         *   If there's a precision setting, it means that we're to add
         *   leading zeros to bring the number of digits up to the
         *   precision. 
         */
        if (digits < opts.prec)
            dispwid += opts.prec - digits;

        /* 
         *   Figure the amount of padding.  If there's an explicit width spec
         *   in the options, and the display width is less than the width
         *   spec, pad by the differene.  
         */
        int padcnt = (opts.width > dispwid ? opts.width - dispwid : 0);

        /* if they want right alignment, add padding characters before */
        if (!opts.left_align)
            putwch(opts.pad, padcnt);

        /* add the + sign if needed */
        if (opts.sign && *p != '-')
            putch(opts.sign);

        /* if there's a '-' sign, write it */
        if (*p == '-')
            putch(*p++), --len;

        /* add the type prefix */
        if (opts.pound && type_prefix != 0 && !zero)
            puts(type_prefix);

        /* add the leading zeros for the precision */
        for (int i = digits ; i < opts.prec ; ++i)
            putch('0');

        /* write the digits, adding grouping commas and converting case */
        for (int dig = 0 ; len != 0 ; ++p, --len, ++dig)
        {
            /* 
             *   if this isn't the first digit, and we have a multiple of
             *   three digits remaining, and we're using grouping, add the
             *   group comma 
             */
            if (opts.group != 0 && dig != 0 && len % 3 == 0)
                putwch(opts.group);

            /* write this character, converting case as needed */
            if (is_digit(*p))
                putch(*p);
            else if ((flags & FI_CAPS) != 0)
                putch((char)toupper(*p));
            else
                putch((char)tolower(*p));
        }

        /* if they want left alignment, add padding characters after */
        if (opts.left_align)
            putwch(opts.pad, padcnt);
    }